

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

ConvertEntropyToMnemonicResponseStruct *
cfd::js::api::HDWalletStructApi::ConvertEntropyToMnemonic
          (ConvertEntropyToMnemonicResponseStruct *__return_storage_ptr__,
          ConvertEntropyToMnemonicRequestStruct *request)

{
  ConvertEntropyToMnemonicRequestStruct *this;
  string *in_R8;
  allocator local_121;
  function<cfd::js::api::ConvertEntropyToMnemonicResponseStruct_(const_cfd::js::api::ConvertEntropyToMnemonicRequestStruct_&)>
  local_120;
  undefined1 local_100 [230];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  ConvertEntropyToMnemonicRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  ConvertEntropyToMnemonicRequestStruct *request_local;
  ConvertEntropyToMnemonicResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  ConvertEntropyToMnemonicResponseStruct::ConvertEntropyToMnemonicResponseStruct
            (__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::ConvertEntropyToMnemonicResponseStruct(cfd::js::api::ConvertEntropyToMnemonicRequestStruct_const&)>
  ::
  function<cfd::js::api::HDWalletStructApi::ConvertEntropyToMnemonic(cfd::js::api::ConvertEntropyToMnemonicRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::ConvertEntropyToMnemonicResponseStruct(cfd::js::api::ConvertEntropyToMnemonicRequestStruct_const&)>
              *)local_100,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"ConvertEntropyToMnemonic",&local_121);
  ExecuteStructApi<cfd::js::api::ConvertEntropyToMnemonicRequestStruct,cfd::js::api::ConvertEntropyToMnemonicResponseStruct>
            ((ConvertEntropyToMnemonicResponseStruct *)(local_100 + 0x20),(api *)this,
             (ConvertEntropyToMnemonicRequestStruct *)local_100,&local_120,in_R8);
  ConvertEntropyToMnemonicResponseStruct::operator=
            (__return_storage_ptr__,(ConvertEntropyToMnemonicResponseStruct *)(local_100 + 0x20));
  ConvertEntropyToMnemonicResponseStruct::~ConvertEntropyToMnemonicResponseStruct
            ((ConvertEntropyToMnemonicResponseStruct *)(local_100 + 0x20));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::
  function<cfd::js::api::ConvertEntropyToMnemonicResponseStruct_(const_cfd::js::api::ConvertEntropyToMnemonicRequestStruct_&)>
  ::~function((function<cfd::js::api::ConvertEntropyToMnemonicResponseStruct_(const_cfd::js::api::ConvertEntropyToMnemonicRequestStruct_&)>
               *)local_100);
  return __return_storage_ptr__;
}

Assistant:

ConvertEntropyToMnemonicResponseStruct
HDWalletStructApi::ConvertEntropyToMnemonic(
    const ConvertEntropyToMnemonicRequestStruct& request) {
  auto call_func = [](const ConvertEntropyToMnemonicRequestStruct& request)
      -> ConvertEntropyToMnemonicResponseStruct {
    ConvertEntropyToMnemonicResponseStruct response;
    ByteData entropy(request.entropy);
    std::string language = request.language;

    // entropy to mnemonic
    HDWalletApi api;
    std::vector<std::string> mnemonic =
        api.ConvertEntropyToMnemonic(entropy, language);

    response.mnemonic = mnemonic;
    return response;
  };

  ConvertEntropyToMnemonicResponseStruct result;
  result = ExecuteStructApi<
      ConvertEntropyToMnemonicRequestStruct,
      ConvertEntropyToMnemonicResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}